

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private.hpp
# Opt level: O1

void baryonyx::info<std::__cxx11::string>
               (context *ctx,char *fmt,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg1)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args;
  undefined1 local_20 [32];
  
  if (5 < (int)ctx->log_priority) {
    local_20._8_8_ = (arg1->_M_dataplus)._M_p;
    local_20._16_8_ = arg1->_M_string_length;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)(local_20 + 8);
    local_20._0_8_ = fmt;
    ::fmt::v7::vprint<char_const*,char>
              (_stdout,(FILE *)(context::message_style + 0x78),(text_style *)local_20,(char **)0xd,
               args);
  }
  return;
}

Assistant:

inline bool
is_loggable(context::message_type current_level, int level) noexcept
{
    return static_cast<int>(current_level) >= level;
}